

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void luaD_hook(lua_State *L,int event,int line)

{
  lua_Hook p_Var1;
  StkId pTVar2;
  CallInfo *pCVar3;
  StkId pTVar4;
  StkId pTVar5;
  StkId pTVar6;
  lua_Debug ar;
  lua_Debug local_a8;
  
  p_Var1 = L->hook;
  if ((p_Var1 != (lua_Hook)0x0) && (L->allowhook != '\0')) {
    pTVar2 = L->top;
    pCVar3 = L->ci;
    pTVar4 = L->stack;
    pTVar5 = pCVar3->top;
    local_a8.event = event;
    local_a8.currentline = line;
    local_a8.i_ci = pCVar3;
    if ((long)L->stack_last - (long)pTVar2 < 0x150) {
      luaD_growstack(L,0x14);
    }
    pCVar3->top = L->top + 0x14;
    L->allowhook = '\0';
    *(byte *)&pCVar3->callstatus = (byte)pCVar3->callstatus | 4;
    (*p_Var1)(L,&local_a8);
    L->allowhook = '\x01';
    pTVar6 = L->stack;
    pCVar3->top = (StkId)(((long)pTVar5 - (long)pTVar4) + (long)pTVar6);
    L->top = (StkId)(((long)pTVar2 - (long)pTVar4) + (long)pTVar6);
    *(byte *)&pCVar3->callstatus = (byte)pCVar3->callstatus & 0xfb;
  }
  return;
}

Assistant:

void luaD_hook (lua_State *L, int event, int line) {
  lua_Hook hook = L->hook;
  if (hook && L->allowhook) {  /* make sure there is a hook */
    CallInfo *ci = L->ci;
    ptrdiff_t top = savestack(L, L->top);
    ptrdiff_t ci_top = savestack(L, ci->top);
    lua_Debug ar;
    ar.event = event;
    ar.currentline = line;
    ar.i_ci = ci;
    luaD_checkstack(L, LUA_MINSTACK);  /* ensure minimum stack size */
    ci->top = L->top + LUA_MINSTACK;
    lua_assert(ci->top <= L->stack_last);
    L->allowhook = 0;  /* cannot call hooks inside a hook */
    ci->callstatus |= CIST_HOOKED;
    lua_unlock(L);
    (*hook)(L, &ar);
    lua_lock(L);
    lua_assert(!L->allowhook);
    L->allowhook = 1;
    ci->top = restorestack(L, ci_top);
    L->top = restorestack(L, top);
    ci->callstatus &= ~CIST_HOOKED;
  }
}